

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddExecutable
          (cmMakefile *this,char *exeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  cmTarget *this_00;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,exeName,&local_41);
  this_00 = AddNewTarget(this,EXECUTABLE,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (excludeFromAll) {
    std::__cxx11::string::string((string *)&local_40,"EXCLUDE_FROM_ALL",&local_41);
    cmTarget::SetProperty(this_00,&local_40,"TRUE");
    std::__cxx11::string::~string((string *)&local_40);
  }
  cmTarget::AddSources(this_00,srcs);
  AddGlobalLinkInformation(this,this_00);
  return this_00;
}

Assistant:

cmTarget* cmMakefile::AddExecutable(const char* exeName,
                                    const std::vector<std::string>& srcs,
                                    bool excludeFromAll)
{
  cmTarget* target = this->AddNewTarget(cmStateEnums::EXECUTABLE, exeName);
  if (excludeFromAll) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(*target);
  return target;
}